

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O2

void __thiscall DatalogDatabase::bruteEvalRules(DatalogDatabase *this,ostream *out)

{
  pointer ppRVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  size_t k;
  ulong uVar7;
  
  iVar2 = totalTuples(this);
  iVar5 = 0;
  iVar6 = -1;
  while (iVar3 = iVar2, iVar3 != iVar6) {
    for (uVar7 = 0;
        ppRVar1 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3);
        uVar7 = uVar7 + 1) {
      evaluateRule(this,ppRVar1[uVar7],out);
    }
    iVar2 = totalTuples(this);
    iVar5 = iVar5 + 1;
    iVar6 = iVar3;
  }
  poVar4 = std::endl<char,std::char_traits<char>>(out);
  poVar4 = std::operator<<(poVar4,"Converged after ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5);
  poVar4 = std::operator<<(poVar4," passes through the Rules.");
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void DatalogDatabase::bruteEvalRules(ostream& out)
{
  int ntuples = totalTuples();
  int lastTuples = -1;
  int nits = 0;

  while (ntuples != lastTuples)
  {
    for (size_t k = 0; k < rules.size(); k++)
    {
      evaluateRule(rules[k], out);
    }
    lastTuples = ntuples;
    ntuples = totalTuples();
    nits++;
  }

  out << endl << "Converged after " << nits << " passes through the Rules." << endl << endl;
}